

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O3

bool swrenderer::R_CheckClipWallSegment(int first,int last)

{
  short *psVar1;
  short *psVar2;
  
  psVar1 = &DAT_0072ca62;
  do {
    psVar2 = psVar1;
    psVar1 = psVar2 + 2;
  } while (*psVar2 < first);
  return *psVar2 < last || first < psVar2[-1];
}

Assistant:

bool R_CheckClipWallSegment (int first, int last)
{
	cliprange_t *start;

	// Find the first range that touches the range
	// (adjacent pixels are touching).
	start = solidsegs;
	while (start->last < first)
		start++;

	if (first < start->first)
	{
		return true;
	}

	// Bottom contained in start?
	if (last > start->last)
	{
		return true;
	}

	return false;
}